

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
* __thiscall
S2Polygon::OperationWithPolyline
          (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
           *__return_storage_ptr__,S2Polygon *this,OpType op_type,SnapFunction *snap_function,
          S2Polyline *a)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  _Head_base<0UL,_S2Shape_*,_false> local_170;
  _Head_base<0UL,_S2Builder::Layer_*,_false> local_168;
  S2Error error;
  S2LogMessage local_138;
  MutableS2ShapeIndex a_index;
  Options local_d0;
  Options local_a4;
  S2BooleanOperation op;
  
  S2BooleanOperation::Options::Options(&local_d0);
  S2BooleanOperation::Options::set_snap_function(&local_d0,snap_function);
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a4.edge_type_ = DIRECTED;
  local_a4.polyline_type_ = WALK;
  local_a4.duplicate_edges_ = KEEP;
  local_a4.sibling_pairs_ = KEEP;
  local_a4.validate_ = false;
  local_a4.s2debug_override_ = ALLOW;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  error._0_8_ = __return_storage_ptr__;
  absl::
  make_unique<s2builderutil::S2PolylineVectorLayer,std::vector<std::unique_ptr<S2Polyline,std::default_delete<S2Polyline>>,std::allocator<std::unique_ptr<S2Polyline,std::default_delete<S2Polyline>>>>*,s2builderutil::S2PolylineVectorLayer::Options&>
            ((absl *)&a_index,
             (vector<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>,_std::allocator<std::unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>_>_>
              **)&error,&local_a4);
  local_168._M_head_impl = (Layer *)a_index.super_S2ShapeIndex;
  a_index.super_S2ShapeIndex._vptr_S2ShapeIndex = (_func_int **)0x0;
  S2BooleanOperation::S2BooleanOperation
            (&op,op_type,
             (unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> *)&local_168,
             &local_d0);
  if (local_168._M_head_impl != (Layer *)0x0) {
    (*(local_168._M_head_impl)->_vptr_Layer[1])();
  }
  local_168._M_head_impl = (Layer *)0x0;
  if (a_index.super_S2ShapeIndex._vptr_S2ShapeIndex != (_func_int **)0x0) {
    (**(code **)(*a_index.super_S2ShapeIndex._vptr_S2ShapeIndex + 8))();
  }
  MutableS2ShapeIndex::MutableS2ShapeIndex(&a_index);
  local_138._0_8_ = a;
  absl::make_unique<S2Polyline::Shape,S2Polyline_const*>((absl *)&error,(S2Polyline **)&local_138);
  local_170._M_head_impl = (S2Shape *)error._0_8_;
  error.code_ = OK;
  error._4_4_ = 0;
  MutableS2ShapeIndex::Add
            (&a_index,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_170);
  if (local_170._M_head_impl != (S2Shape *)0x0) {
    (*(local_170._M_head_impl)->_vptr_S2Shape[1])();
  }
  local_170._M_head_impl = (S2Shape *)0x0;
  if (error._0_8_ != 0) {
    (**(code **)(*(long *)error._0_8_ + 8))();
  }
  error._0_8_ = error._0_8_ & 0xffffffff00000000;
  error.text_._M_dataplus._M_p = (pointer)&error.text_.field_2;
  error.text_._M_string_length = 0;
  error.text_.field_2._M_local_buf[0] = '\0';
  bVar1 = S2BooleanOperation::Build
                    (&op,&a_index.super_S2ShapeIndex,&(this->index_).super_S2ShapeIndex,&error);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&error.text_);
    MutableS2ShapeIndex::~MutableS2ShapeIndex(&a_index);
    S2BooleanOperation::~S2BooleanOperation(&op);
    if (local_d0.snap_function_._M_t.
        super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
        .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>)0x0
       ) {
      (*(*(_func_int ***)
          local_d0.snap_function_._M_t.
          super___uniq_ptr_impl<S2Builder::SnapFunction,_std::default_delete<S2Builder::SnapFunction>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2Builder::SnapFunction_*,_std::default_delete<S2Builder::SnapFunction>_>
          .super__Head_base<0UL,_S2Builder::SnapFunction_*,_false>._M_head_impl)[1])();
    }
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&local_138,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polygon.cc"
             ,0x49f,kFatal,(ostream *)&std::cerr);
  poVar2 = std::operator<<(local_138.stream_,"Polyline ");
  pcVar3 = S2BooleanOperation::OpTypeToString(op_type);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2," operation failed: ");
  ::operator<<(poVar2,&error);
  abort();
}

Assistant:

vector<unique_ptr<S2Polyline>> S2Polygon::OperationWithPolyline(
    S2BooleanOperation::OpType op_type,
    const S2Builder::SnapFunction& snap_function,
    const S2Polyline& a) const {
  S2BooleanOperation::Options options;
  options.set_snap_function(snap_function);
  vector<unique_ptr<S2Polyline>> result;
  S2PolylineVectorLayer::Options layer_options;
  layer_options.set_polyline_type(
      S2PolylineVectorLayer::Options::PolylineType::WALK);
  S2BooleanOperation op(
      op_type, make_unique<S2PolylineVectorLayer>(&result, layer_options),
      options);
  MutableS2ShapeIndex a_index;
  a_index.Add(make_unique<S2Polyline::Shape>(&a));
  S2Error error;
  if (!op.Build(a_index, index_, &error)) {
    S2_LOG(DFATAL) << "Polyline " << S2BooleanOperation::OpTypeToString(op_type)
                << " operation failed: " << error;
  }
  return result;
}